

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O1

StatusOr<google::protobuf::FeatureResolver> * __thiscall
google::protobuf::(anonymous_namespace)::
SetupFeatureResolver<google::protobuf::internal::ExtensionIdentifier<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false>>
          (StatusOr<google::protobuf::FeatureResolver> *__return_storage_ptr__,
          _anonymous_namespace_ *this,Edition edition,
          ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
          extensions)

{
  FieldDescriptor *pFVar1;
  undefined4 in_register_00000014;
  Metadata MVar2;
  Metadata MVar3;
  Span<const_google::protobuf::FieldDescriptor_*const> extensions_00;
  Status _status;
  StatusOr<google::protobuf::FeatureSetDefaults> defaults;
  StatusOrData<google::protobuf::FeatureSetDefaults> local_70;
  ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
  local_30;
  
  local_30.default_value_ = (InitType)CONCAT44(in_register_00000014,edition);
  local_30.number_ = (int)this;
  MVar2 = FeatureSet::GetMetadata((FeatureSet *)&_FeatureSet_default_instance_);
  MVar3 = FeatureSet::GetMetadata((FeatureSet *)&_FeatureSet_default_instance_);
  pFVar1 = GetExtension<google::protobuf::internal::ExtensionIdentifier<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false>>
                     (&local_30,MVar3.descriptor);
  extensions_00.len_ = 1000;
  extensions_00.ptr_ = (pointer)0x1;
  FeatureResolver::CompileDefaults
            ((StatusOr<google::protobuf::FeatureSetDefaults> *)&local_70,
             (FeatureResolver *)MVar2.descriptor,(Descriptor *)&stack0xffffffffffffff88,
             extensions_00,EDITION_99997_TEST_ONLY,(Edition)pFVar1);
  if (((ulong)local_70.field_0 & 1) == 0) {
    LOCK();
    *(int *)local_70.field_0 = *(int *)local_70.field_0 + 1;
    UNLOCK();
  }
  if (local_70.field_0 ==
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)0x1) {
    FeatureResolver::Create(__return_storage_ptr__,EDITION_2023,&local_70.field_1.data_);
  }
  else {
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
    StatusOrData<const_absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureResolver>,
               (Status *)&stack0xffffffffffffff88);
    absl::lts_20250127::Status::~Status((Status *)&stack0xffffffffffffff88);
  }
  absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
  ~StatusOrData(&local_70);
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureResolver> SetupFeatureResolver(Edition edition,
                                                     Extensions... extensions) {
  absl::StatusOr<FeatureSetDefaults> defaults =
      FeatureResolver::CompileDefaults(FeatureSet::descriptor(),
                                       {GetExtension(extensions)...},
                                       EDITION_2023, EDITION_99997_TEST_ONLY);
  RETURN_IF_ERROR(defaults.status());
  return FeatureResolver::Create(edition, *defaults);
}